

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDisjointSets.h
# Opt level: O2

void __thiscall
HighsDisjointSets<false>::merge(HighsDisjointSets<false> *this,HighsInt item1,HighsInt item2)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  long lVar4;
  HighsInt HVar5;
  HighsInt HVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  
  HVar5 = getSet(this,item1);
  HVar6 = getSet(this,item2);
  if (HVar5 != HVar6) {
    lVar7 = (long)HVar5;
    piVar3 = (this->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = piVar3[lVar7];
    lVar9 = (long)HVar6;
    iVar1 = piVar3[lVar9];
    lVar10 = lVar9;
    lVar4 = lVar7;
    if (iVar1 < iVar2) {
      lVar10 = lVar7;
      lVar4 = lVar9;
      HVar6 = HVar5;
    }
    (this->sets).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar4] = HVar6;
    piVar8 = piVar3 + lVar7;
    if (iVar1 < iVar2) {
      piVar8 = piVar3 + lVar9;
    }
    piVar3[lVar10] = piVar3[lVar10] + *piVar8;
  }
  return;
}

Assistant:

void merge(HighsInt item1, HighsInt item2) {
    assert(item1 >= 0 && item1 < (HighsInt)sets.size());
    assert(item2 >= 0 && item2 < (HighsInt)sets.size());

    HighsInt repr1 = getSet(item1);
    assert(sets[repr1] == repr1);
    assert(repr1 >= 0 && repr1 < (HighsInt)sets.size());

    HighsInt repr2 = getSet(item2);
    assert(sets[repr2] == repr2);
    assert(repr2 >= 0 && repr2 < (HighsInt)sets.size());
    assert(sizes.size() == sets.size());

    if (repr1 == repr2) return;

    if (kMinimalRepresentative) {
      if (repr2 > repr1) {
        sets[repr2] = repr1;
        sizes[repr1] += sizes[repr2];
      } else {
        sets[repr1] = repr2;
        sizes[repr2] += sizes[repr1];
      }
    } else {
      if (sizes[repr1] > sizes[repr2]) {
        sets[repr2] = repr1;
        sizes[repr1] += sizes[repr2];
      } else {
        sets[repr1] = repr2;
        sizes[repr2] += sizes[repr1];
      }
    }
  }